

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCStress.cpp
# Opt level: O1

void SwapObjects(void)

{
  RecyclerTestObject *value;
  RecyclerTestObject *value_00;
  Location LVar1;
  Location local_40;
  Location local_30;
  
  LVar1 = GetRandomLocation();
  local_40.location = LVar1.location;
  local_40.type = LVar1.type;
  LVar1 = GetRandomLocation();
  local_30.location = LVar1.location;
  local_30.type = LVar1.type;
  value = Location::Get(&local_40);
  value_00 = Location::Get(&local_30);
  Location::Set(&local_40,value_00);
  Location::Set(&local_30,value);
  return;
}

Assistant:

void SwapObjects()
{
    // Walk to two random locations in the current object graph
    Location location1 = GetRandomLocation();
    Location location2 = GetRandomLocation();

    // Swap their references.
    RecyclerTestObject * object = location1.Get();
    location1.Set(location2.Get());
    location2.Set(object);
}